

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool GetEQ(ConfigScanner *sc)

{
  char cVar1;
  
  if (sc != (ConfigScanner *)0x0) {
    cVar1 = *sc->ptr;
    if (cVar1 == '=') {
      sc->ptr = sc->ptr + 1;
    }
    return cVar1 == '=';
  }
  return false;
}

Assistant:

bool GetEQ(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	bool result = *sc->ptr == '=';
	if (result)
	{
		sc->ptr++;
	}
	return result;
}